

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O0

localization_backend_manager
booster::locale::localization_backend_manager::global(localization_backend_manager *in)

{
  localization_backend_manager *this;
  unique_lock<std::mutex> *in_RSI;
  _Head_base<0UL,_booster::locale::localization_backend_manager::impl_*,_false> in_RDI;
  unique_lock<std::mutex> lock;
  localization_backend_manager *mgr;
  mutex_type *in_stack_ffffffffffffff98;
  unique_lock<std::mutex> *in_stack_ffffffffffffffa0;
  localization_backend_manager *in_stack_ffffffffffffffc8;
  localization_backend_manager *in_stack_ffffffffffffffd0;
  
  anon_unknown_0::localization_backend_manager_mutex();
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this = anon_unknown_0::localization_backend_manager_global();
  localization_backend_manager(this,(localization_backend_manager *)in_RDI._M_head_impl);
  anon_unknown_0::localization_backend_manager_global();
  operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_lock<std::mutex>::~unique_lock(in_RSI);
  return (unique_ptr<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
          )(unique_ptr<booster::locale::localization_backend_manager::impl,_std::default_delete<booster::locale::localization_backend_manager::impl>_>
            )in_RDI._M_head_impl;
}

Assistant:

localization_backend_manager localization_backend_manager::global(localization_backend_manager const &in)
        {
            booster::unique_lock<booster::mutex> lock(localization_backend_manager_mutex());
            localization_backend_manager mgr = localization_backend_manager_global();
            localization_backend_manager_global() = in;
            return mgr;
        }